

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

float __thiscall
baryonyx::itm::quadratic_cost_type<float>::operator[](quadratic_cost_type<float> *this,int index)

{
  int iVar1;
  type pfVar2;
  type piVar3;
  type pqVar4;
  int local_1c;
  int last;
  int first;
  float ret;
  int index_local;
  quadratic_cost_type<float> *this_local;
  
  pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                     (&this->linear_elements,(long)index);
  last = (int)*pfVar2;
  piVar3 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->indices,(long)index);
  local_1c = *piVar3;
  piVar3 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->indices,(long)(index + 1));
  iVar1 = *piVar3;
  for (; local_1c != iVar1; local_1c = local_1c + 1) {
    pqVar4 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)local_1c);
    last = (int)(pqVar4->factor + (float)last);
  }
  return (float)last;
}

Assistant:

Float operator[](int index) const noexcept
    {
        Float ret = linear_elements[index];

        auto first = indices[index];
        auto last = indices[index + 1];

        for (; first != last; ++first)
            ret += quadratic_elements[first].factor;

        return ret;
    }